

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggressivePlayerStrategy.cpp
# Opt level: O2

void __thiscall
AggressivePlayerStrategy::execute(AggressivePlayerStrategy *this,Game *game,Player *player)

{
  bool bVar1;
  int iVar2;
  Map *pMVar3;
  ostream *poVar4;
  string *psVar5;
  allocator local_a9;
  string choice;
  string local_88;
  string local_68;
  string local_48;
  
  Player::rollAggressive(player);
  Game::resolvePlayer(game,player,false);
  iVar2 = Player::getLifePoints(player);
  if (iVar2 < 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Player : ");
    psVar5 = Player::getPlayerName_abi_cxx11_(player);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    poVar4 = std::operator<<(poVar4," died while resolving dice");
    std::endl<char,std::char_traits<char>>(poVar4);
    return;
  }
  iVar2 = Player::getZone(player);
  if (iVar2 < 1) {
LAB_001135d2:
    pMVar3 = Game::getGameMap(game);
    bVar1 = Map::isManhattanEmpty(pMVar3);
    if (!bVar1) {
      pMVar3 = Game::getGameMap(game);
      std::__cxx11::string::string((string *)&local_88,"aggressive",(allocator *)&choice);
      Map::moveComputer(pMVar3,player,&local_88);
      psVar5 = &local_88;
      goto LAB_001137cb;
    }
    Player::setPhase(player,Move);
    iVar2 = Game::getNumberOfPlayers(game);
    if (iVar2 < 5) {
      Player::setZone(player,1);
      pMVar3 = Game::getGameMap(game);
      Map::setRegionOwner(pMVar3,1,player);
      poVar4 = std::operator<<((ostream *)&std::cout,"Player : ");
      psVar5 = Player::getPlayerName_abi_cxx11_(player);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4," is in : ");
      Player::getZoneName_abi_cxx11_(&choice,player);
      poVar4 = std::operator<<(poVar4,(string *)&choice);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      Player::setZone(player,4);
      pMVar3 = Game::getGameMap(game);
      Map::setRegionOwner(pMVar3,4,player);
      poVar4 = std::operator<<((ostream *)&std::cout,"Player : ");
      psVar5 = Player::getPlayerName_abi_cxx11_(player);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4," is in : ");
      Player::getZoneName_abi_cxx11_(&choice,player);
      poVar4 = std::operator<<(poVar4,(string *)&choice);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  else {
    iVar2 = Player::getZone(player);
    if (6 < iVar2) goto LAB_001135d2;
    Player::setPhase(player,Move);
    choice._M_dataplus._M_p = (pointer)&choice.field_2;
    choice._M_string_length = 0;
    choice.field_2._M_local_buf[0] = '\0';
    iVar2 = Player::getZone(player);
    if (iVar2 == 1) {
      iVar2 = 2;
      Player::setZone(player,2);
      pMVar3 = Game::getGameMap(game);
LAB_001137b9:
      Map::setRegionOwner(pMVar3,iVar2,player);
    }
    else {
      iVar2 = Player::getZone(player);
      if (iVar2 == 2) {
        iVar2 = 3;
        Player::setZone(player,3);
        pMVar3 = Game::getGameMap(game);
        goto LAB_001137b9;
      }
      iVar2 = Player::getZone(player);
      if (iVar2 != 3) {
        iVar2 = Player::getZone(player);
        if (iVar2 == 4) {
          iVar2 = 5;
          Player::setZone(player,5);
          pMVar3 = Game::getGameMap(game);
        }
        else {
          iVar2 = Player::getZone(player);
          if (iVar2 != 5) {
            iVar2 = Player::getZone(player);
            if (iVar2 == 6) {
              pMVar3 = Game::getGameMap(game);
              std::__cxx11::string::string((string *)&local_68,"aggressive",&local_a9);
              Map::moveComputer(pMVar3,player,&local_68);
              psVar5 = &local_68;
              goto LAB_0011382e;
            }
            goto LAB_001137c6;
          }
          iVar2 = 6;
          Player::setZone(player,6);
          pMVar3 = Game::getGameMap(game);
        }
        goto LAB_001137b9;
      }
      pMVar3 = Game::getGameMap(game);
      std::__cxx11::string::string((string *)&local_48,"outmanhattan",&local_a9);
      Map::moveComputer(pMVar3,player,&local_48);
      psVar5 = &local_48;
LAB_0011382e:
      std::__cxx11::string::~string((string *)psVar5);
    }
  }
LAB_001137c6:
  psVar5 = &choice;
LAB_001137cb:
  std::__cxx11::string::~string((string *)psVar5);
  Game::buyCardsComputer(game,player);
  return;
}

Assistant:

void AggressivePlayerStrategy::execute(Game *game, Player *player) {

    /*
		The aggressive player strategy will have this player profile:
			- During dice rolls : Will reroll anything that is not Destruction or Attack.
			- Resolve dices : Will just resolve in whatever order the dices are returned.
			- Move : Will always try to get out off manhattan whenever he has the occasion, if not in manhattan will stay same position.
			- Buy cards: Will always try to buy a card.
	*/

    player->rollAggressive();
    // resolve the dice (mandatory) unordered
    game->resolvePlayer(player, false);

    if(player->getLifePoints() <= 0) {
        cout << "Player : " << player->getPlayerName() << " died while resolving dice" << endl;
        return;
    }
    // move

    // if player is in manhattan
    if(player->getZone()>0 && player->getZone()<7){
        player->setPhase(Player::Phase::Move);
        std::string choice;
        if(player->getZone() == 1) {  // Manhattan Lower 2-4
            player->setZone(2);
            game->getGameMap()->setRegionOwner(2, player);
        }
        else if(player->getZone() == 2) {  // Manhattan Midtown 2-4
            player->setZone(3);
            game->getGameMap()->setRegionOwner(3, player);
        }
        else if(player->getZone() == 3) {  // Manhattan Upper 2-4
                game->getGameMap()->moveComputer(player, "outmanhattan");
        }
        else if(player->getZone() == 4) {  // Manhattan Lower 5-6
            player->setZone(5);
            game->getGameMap()->setRegionOwner(5, player);
        }
        else if(player->getZone() == 5) {  // Manhattan Midtown 5-6
            player->setZone(6);
            game->getGameMap()->setRegionOwner(6, player);
        }
        else if(player->getZone() == 6) {  // Manhattan Upper 5-6

                game->getGameMap()->moveComputer(player, "aggressive");
        }


    }
    else { // Not in manhattan
        if(game->getGameMap()->isManhattanEmpty()){ // must move to manhattan if empty
            player->setPhase(Player::Phase::Move);
            if (game->getNumberOfPlayers() < 5){
                player->setZone(1);
                game->getGameMap()->setRegionOwner(1, player);
                cout << "Player : " << player->getPlayerName() << " is in : " << player->getZoneName() << endl;
            }
            else{
                player->setZone(4);
                game->getGameMap()->setRegionOwner(4, player);
                cout << "Player : " << player->getPlayerName() << " is in : " << player->getZoneName() << endl;
            }
        }
        else{ // there is atleast 1 player in manhattan
                game->getGameMap()->moveComputer(player, "aggressive");
        }

    }

    // buy cards (optional)
    game->buyCardsComputer(player);

}